

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Abc_NtkPerformMfs3(Abc_Ntk_t *pNtk,Sfm_Par_t *pPars)

{
  int iVar1;
  Sfm_Dec_t *p_00;
  char *pcVar2;
  Sfm_Dec_t *p;
  Sfm_Par_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  p_00 = Sfm_DecStart(pPars,(Mio_Library_t *)pNtk->pManFunc,pNtk);
  if (pPars->fVerbose != 0) {
    printf("Remapping parameters: ");
    if (pPars->nTfoLevMax != 0) {
      printf("TFO = %d. ",(ulong)(uint)pPars->nTfoLevMax);
    }
    if (pPars->nTfiLevMax != 0) {
      printf("TFI = %d. ",(ulong)(uint)pPars->nTfiLevMax);
    }
    if (pPars->nFanoutMax != 0) {
      printf("FanMax = %d. ",(ulong)(uint)pPars->nFanoutMax);
    }
    if (pPars->nWinSizeMax != 0) {
      printf("WinMax = %d. ",(ulong)(uint)pPars->nWinSizeMax);
    }
    if (pPars->nBTLimit != 0) {
      printf("Confl = %d. ",(ulong)(uint)pPars->nBTLimit);
    }
    if ((pPars->nMffcMin != 0) && (pPars->fArea != 0)) {
      printf("MffcMin = %d. ",(ulong)(uint)pPars->nMffcMin);
    }
    if ((pPars->nMffcMax != 0) && (pPars->fArea != 0)) {
      printf("MffcMax = %d. ",(ulong)(uint)pPars->nMffcMax);
    }
    if (pPars->nDecMax != 0) {
      printf("DecMax = %d. ",(ulong)(uint)pPars->nDecMax);
    }
    if (pPars->iNodeOne != 0) {
      printf("Pivot = %d. ",(ulong)(uint)pPars->iNodeOne);
    }
    if (pPars->fArea == 0) {
      printf("Win = %d. ",(ulong)(uint)pPars->nTimeWin);
    }
    if (pPars->fArea == 0) {
      printf("Delta = %.2f ps. ",(double)p_00->DeltaCrit * 0.001);
    }
    if (pPars->fArea != 0) {
      pcVar2 = "no";
      if (pPars->fZeroCost != 0) {
        pcVar2 = "yes";
      }
      printf("0-cost = %s. ",pcVar2);
    }
    pcVar2 = "no";
    if (pPars->fMoreEffort != 0) {
      pcVar2 = "yes";
    }
    printf("Effort = %s. ",pcVar2);
    pcVar2 = "no";
    if (pPars->fUseSim != 0) {
      pcVar2 = "yes";
    }
    printf("Sim = %s. ",pcVar2);
    printf("\n");
  }
  Abc_NtkLevel(pNtk);
  if (p_00->pPars->fUseSim != 0) {
    Sfm_NtkSimulate(pNtk);
  }
  if (pPars->fVerbose != 0) {
    iVar1 = Abc_NtkNodeNum(pNtk);
    p_00->nTotalNodesBeg = iVar1;
  }
  if (pPars->fVerbose != 0) {
    iVar1 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalEdgesBeg = iVar1;
  }
  if (pPars->fArea == 0) {
    Abc_NtkDelayOpt(p_00);
  }
  else if (pPars->fAreaRev == 0) {
    Abc_NtkAreaOpt(p_00);
  }
  else {
    Abc_NtkAreaOpt2(p_00);
  }
  if (pPars->fVerbose != 0) {
    iVar1 = Abc_NtkNodeNum(pNtk);
    p_00->nTotalNodesEnd = iVar1;
  }
  if (pPars->fVerbose != 0) {
    iVar1 = Abc_NtkGetTotalFanins(pNtk);
    p_00->nTotalEdgesEnd = iVar1;
  }
  if (pPars->fVerbose != 0) {
    Sfm_DecPrintStats(p_00);
  }
  if (pPars->fLibVerbose != 0) {
    Sfm_LibPrint(p_00->pLib);
  }
  Sfm_DecStop(p_00);
  return;
}

Assistant:

void Abc_NtkPerformMfs3( Abc_Ntk_t * pNtk, Sfm_Par_t * pPars )
{
    Sfm_Dec_t * p = Sfm_DecStart( pPars, (Mio_Library_t *)pNtk->pManFunc, pNtk );
    if ( pPars->fVerbose )
    {
        printf( "Remapping parameters: " );
        if ( pPars->nTfoLevMax )
            printf( "TFO = %d. ",     pPars->nTfoLevMax );
        if ( pPars->nTfiLevMax )
            printf( "TFI = %d. ",     pPars->nTfiLevMax );
        if ( pPars->nFanoutMax )
            printf( "FanMax = %d. ",  pPars->nFanoutMax );
        if ( pPars->nWinSizeMax )
            printf( "WinMax = %d. ",  pPars->nWinSizeMax );
        if ( pPars->nBTLimit )
            printf( "Confl = %d. ",   pPars->nBTLimit );
        if ( pPars->nMffcMin && pPars->fArea )
            printf( "MffcMin = %d. ", pPars->nMffcMin );
        if ( pPars->nMffcMax && pPars->fArea )
            printf( "MffcMax = %d. ", pPars->nMffcMax );
        if ( pPars->nDecMax )
            printf( "DecMax = %d. ",  pPars->nDecMax );
        if ( pPars->iNodeOne )
            printf( "Pivot = %d. ",   pPars->iNodeOne );
        if ( !pPars->fArea )
            printf( "Win = %d. ",     pPars->nTimeWin );
        if ( !pPars->fArea )
            printf( "Delta = %.2f ps. ", MIO_NUMINV*p->DeltaCrit );
        if ( pPars->fArea )
            printf( "0-cost = %s. ",  pPars->fZeroCost ? "yes" : "no" );
        printf( "Effort = %s. ",      pPars->fMoreEffort ? "yes" : "no" );
        printf( "Sim = %s. ",         pPars->fUseSim ? "yes" : "no" );
        printf( "\n" );
    }
    // preparation steps
    Abc_NtkLevel( pNtk );
    if ( p->pPars->fUseSim )
        Sfm_NtkSimulate( pNtk );
    // record statistics
    if ( pPars->fVerbose ) p->nTotalNodesBeg = Abc_NtkNodeNum(pNtk);
    if ( pPars->fVerbose ) p->nTotalEdgesBeg = Abc_NtkGetTotalFanins(pNtk);
    // perform optimization
    if ( pPars->fArea )
    {
        if ( pPars->fAreaRev )
            Abc_NtkAreaOpt2( p );
        else
            Abc_NtkAreaOpt( p );
    }
    else
        Abc_NtkDelayOpt( p );
    // record statistics
    if ( pPars->fVerbose ) p->nTotalNodesEnd = Abc_NtkNodeNum(pNtk);
    if ( pPars->fVerbose ) p->nTotalEdgesEnd = Abc_NtkGetTotalFanins(pNtk);
    // print stats and quit
    if ( pPars->fVerbose )
    Sfm_DecPrintStats( p );
    if ( pPars->fLibVerbose )
        Sfm_LibPrint( p->pLib );
    Sfm_DecStop( p );
}